

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_kpr_mri.c
# Opt level: O0

int Jf(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix J,void *user_data,N_Vector tmp1,N_Vector tmp2,
      N_Vector tmp3)

{
  double dVar1;
  double dVar2;
  long *plVar3;
  void *in_RCX;
  int in_EDX;
  undefined4 in_register_00000014;
  void *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  double t_00;
  double extraout_XMM0_Qa;
  sunrealtype sVar4;
  sunrealtype v;
  sunrealtype u;
  sunrealtype e;
  sunrealtype *rpar;
  void *user_data_00;
  
  plVar3 = (long *)CONCAT44(in_register_00000014,in_EDX);
  user_data_00 = *(void **)((long)in_RCX + 0x10);
  dVar1 = **(double **)(*in_RDI + 0x10);
  dVar2 = *(double *)(*(long *)(*in_RDI + 0x10) + 8);
  *(undefined8 *)**(undefined8 **)(*plVar3 + 0x20) = 0;
  **(undefined8 **)(*(long *)(*plVar3 + 0x20) + 8) = 0;
  t_00 = (double)user_data_00 / 2.0;
  r(in_RCX,in_RSI,in_EDX,(char *)in_RCX,in_R8D,in_R9D);
  *(double *)(**(long **)(*plVar3 + 0x20) + 8) =
       t_00 + ((double)user_data_00 * (extraout_XMM0_Qa + 1.0)) / (dVar1 * 2.0 * dVar1);
  sVar4 = s(t_00,user_data_00);
  *(double *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + 8) =
       -0.5 - (sVar4 + 2.0) / (dVar2 * 2.0 * dVar2);
  return 0;
}

Assistant:

static int Jf(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix J,
              void* user_data, N_Vector tmp1, N_Vector tmp2, N_Vector tmp3)
{
  sunrealtype* rpar   = (sunrealtype*)user_data;
  const sunrealtype e = rpar[2];
  const sunrealtype u = NV_Ith_S(y, 0);
  const sunrealtype v = NV_Ith_S(y, 1);

  /* fill in the Jacobian:
     [        0                           0        ]
     [e/2+e*(1+r(t))/(2*u^2)  -1/2-(2+s(t))/(2*v^2)] */
  SM_ELEMENT_D(J, 0, 0) = ZERO;
  SM_ELEMENT_D(J, 0, 1) = ZERO;
  SM_ELEMENT_D(J, 1, 0) = e / TWO + e * (ONE + r(t, rpar)) / (TWO * u * u);
  SM_ELEMENT_D(J, 1, 1) = -ONE / TWO - (TWO + s(t, rpar)) / (TWO * v * v);

  /* Return with success */
  return 0;
}